

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COMVel.cpp
# Opt level: O1

void __thiscall OpenMD::COMVel::writeSequence(COMVel *this)

{
  char cVar1;
  ostream *poVar2;
  pointer pdVar3;
  uint uVar4;
  ulong uVar5;
  Revision r;
  ofstream ofs;
  Revision local_251;
  string local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream
            (&local_230,(this->super_SequentialAnalyzer).outputFilename_._M_dataplus._M_p,_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"COMVel::writeSequence Error: failed to open %s\n",
             (this->super_SequentialAnalyzer).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,
                        (this->super_SequentialAnalyzer).sequenceType_._M_dataplus._M_p,
                        (this->super_SequentialAnalyzer).sequenceType_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# OpenMD ",9);
    Revision::getFullRevision_abi_cxx11_(&local_250,&local_251);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,local_250._M_dataplus._M_p,local_250._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
    Revision::getBuildDate_abi_cxx11_(&local_250,&local_251);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,local_250._M_dataplus._M_p,local_250._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# selection script1: \"",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,
               (this->super_SequentialAnalyzer).selectionScript1_._M_dataplus._M_p,
               (this->super_SequentialAnalyzer).selectionScript1_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"\"\tselection script2: \"",0x16);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,
                        (this->super_SequentialAnalyzer).selectionScript2_._M_dataplus._M_p,
                        (this->super_SequentialAnalyzer).selectionScript2_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
    if ((this->super_SequentialAnalyzer).paramString_._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# parameters: ",0xe)
      ;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,
                          (this->super_SequentialAnalyzer).paramString_._M_dataplus._M_p,
                          (this->super_SequentialAnalyzer).paramString_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#time\tvalue\n",0xc);
    pdVar3 = (this->super_SequentialAnalyzer).times_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if ((this->super_SequentialAnalyzer).times_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish != pdVar3) {
      uVar4 = 1;
      uVar5 = 0;
      do {
        poVar2 = std::ostream::_M_insert<double>(pdVar3[uVar5]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->values_).
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar5].
                            super_Vector<double,_3U>.data_[0]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->values_).
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar5].
                            super_Vector<double,_3U>.data_[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->values_).
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar5].
                            super_Vector<double,_3U>.data_[2]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        uVar5 = (ulong)uVar4;
        pdVar3 = (this->super_SequentialAnalyzer).times_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar4 = uVar4 + 1;
      } while (uVar5 < (ulong)((long)(this->super_SequentialAnalyzer).times_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pdVar3 >> 3));
    }
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void COMVel::writeSequence() {
    std::ofstream ofs(outputFilename_.c_str(), std::ios::binary);

    if (ofs.is_open()) {
      Revision r;

      ofs << "# " << getSequenceType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      ofs << "# selection script1: \"" << selectionScript1_;
      ofs << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      ofs << "#time\tvalue\n";

      for (unsigned int i = 0; i < times_.size(); ++i) {
        ofs << times_[i] << "\t" << values_[i].x() << "\t" << values_[i].y()
            << "\t" << values_[i].z() << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "COMVel::writeSequence Error: failed to open %s\n",
               outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    ofs.close();
  }